

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O1

sljit_s32 emit_mov_int(sljit_compiler *compiler,sljit_s32 sign,sljit_s32 dst,sljit_sw dstw,
                      sljit_s32 src,sljit_sw srcw)

{
  sljit_s32 sVar1;
  sljit_s32 sVar2;
  sljit_u8 *psVar3;
  
  compiler->mode32 = 0;
  if ((src & 0x80U) == 0 && dst == 0) {
    return 0;
  }
  if ((src & 0x40U) == 0) {
    sVar1 = 0xf;
    if (dst < 0x40) {
      sVar1 = dst;
    }
    if (-1 < (char)dst || 0x3f < src) {
      if (sign == 0) {
        compiler->mode32 = 1;
        sVar2 = emit_mov(compiler,sVar1,0,src,srcw);
        if (sVar2 != 0) goto LAB_00154e8f;
        compiler->mode32 = 0;
        src = sVar1;
      }
      else {
        psVar3 = emit_x86_instruction(compiler,1,sVar1,0,src,srcw);
        if (psVar3 == (sljit_u8 *)0x0) goto LAB_00154e8f;
        *psVar3 = 'c';
        src = sVar1;
      }
    }
    if (-1 < (char)dst) {
      return 0;
    }
    compiler->mode32 = 1;
    psVar3 = emit_x86_instruction(compiler,1,src,0,dst,dstw);
    if (psVar3 != (sljit_u8 *)0x0) {
      *psVar3 = 0x89;
LAB_00154e3b:
      compiler->mode32 = 0;
      return 0;
    }
  }
  else if (dst < 0x40) {
    if ((sign == 0) && (0x7fffffff < (ulong)srcw)) {
      sVar1 = emit_load_imm64(compiler,dst,srcw);
      return sVar1;
    }
    psVar3 = emit_x86_instruction(compiler,1,0x40,(long)(int)srcw,dst,dstw);
    if (psVar3 != (sljit_u8 *)0x0) {
      *psVar3 = 199;
      return 0;
    }
  }
  else {
    compiler->mode32 = 1;
    psVar3 = emit_x86_instruction(compiler,1,0x40,(long)(int)srcw,dst,dstw);
    if (psVar3 != (sljit_u8 *)0x0) {
      *psVar3 = 199;
      goto LAB_00154e3b;
    }
  }
LAB_00154e8f:
  return compiler->error;
}

Assistant:

static sljit_s32 emit_mov_int(struct sljit_compiler *compiler, sljit_s32 sign,
	sljit_s32 dst, sljit_sw dstw,
	sljit_s32 src, sljit_sw srcw)
{
	sljit_u8* inst;
	sljit_s32 dst_r;

	compiler->mode32 = 0;

	if (dst == SLJIT_UNUSED && !(src & SLJIT_MEM))
		return SLJIT_SUCCESS; /* Empty instruction. */

	if (src & SLJIT_IMM) {
		if (FAST_IS_REG(dst)) {
			if (sign || ((sljit_uw)srcw <= 0x7fffffff)) {
				inst = emit_x86_instruction(compiler, 1, SLJIT_IMM, (sljit_sw)(sljit_s32)srcw, dst, dstw);
				FAIL_IF(!inst);
				*inst = MOV_rm_i32;
				return SLJIT_SUCCESS;
			}
			return emit_load_imm64(compiler, dst, srcw);
		}
		compiler->mode32 = 1;
		inst = emit_x86_instruction(compiler, 1, SLJIT_IMM, (sljit_sw)(sljit_s32)srcw, dst, dstw);
		FAIL_IF(!inst);
		*inst = MOV_rm_i32;
		compiler->mode32 = 0;
		return SLJIT_SUCCESS;
	}

	dst_r = FAST_IS_REG(dst) ? dst : TMP_REG1;

	if ((dst & SLJIT_MEM) && FAST_IS_REG(src))
		dst_r = src;
	else {
		if (sign) {
			inst = emit_x86_instruction(compiler, 1, dst_r, 0, src, srcw);
			FAIL_IF(!inst);
			*inst++ = MOVSXD_r_rm;
		} else {
			compiler->mode32 = 1;
			FAIL_IF(emit_mov(compiler, dst_r, 0, src, srcw));
			compiler->mode32 = 0;
		}
	}

	if (dst & SLJIT_MEM) {
		compiler->mode32 = 1;
		inst = emit_x86_instruction(compiler, 1, dst_r, 0, dst, dstw);
		FAIL_IF(!inst);
		*inst = MOV_rm_r;
		compiler->mode32 = 0;
	}

	return SLJIT_SUCCESS;
}